

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O2

void __thiscall QPrintPreviewDialogPrivate::_q_zoomFactorChanged(QPrintPreviewDialogPrivate *this)

{
  QComboBox *pQVar1;
  bool *pbVar2;
  QPrintPreviewDialogPrivate *this_00;
  long in_FS_OFFSET;
  float fVar3;
  double value;
  QArrayDataPointer<char16_t> local_58;
  bool ok;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = -0x5555555555555556;
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QComboBox::lineEdit();
  QLineEdit::text();
  this_00 = (QPrintPreviewDialogPrivate *)&ok;
  ok = true;
  pbVar2 = (bool *)QString::remove((QChar)(char16_t)&local_38,0x25);
  fVar3 = (float)QString::toFloat(pbVar2);
  if (ok == true) {
    value = 1000.0;
    if ((double)fVar3 <= 1000.0) {
      value = (double)fVar3;
    }
    if (value <= 1.0) {
      value = 1.0;
    }
    QPrintPreviewWidget::setZoomFactor((QPrintPreviewWidget *)this->preview,value / 100.0);
    pQVar1 = this->zoomFactor;
    formattedZoomFactor((QString *)&local_58,this_00,value);
    QComboBox::setEditText((QString *)pQVar1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    setFitting(this,false);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewDialogPrivate::_q_zoomFactorChanged()
{
    QString text = zoomFactor->lineEdit()->text();
    bool ok;
    qreal factor = text.remove(u'%').toFloat(&ok);
    factor = qMax(qreal(1.0), qMin(qreal(1000.0), factor));
    if (ok) {
        preview->setZoomFactor(factor/100.0);
        zoomFactor->setEditText(formattedZoomFactor(factor));
        setFitting(false);
    }
}